

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QDBusIntrospection::Interface>::~QSharedDataPointer
          (QSharedDataPointer<QDBusIntrospection::Interface> *this)

{
  Interface *pIVar1;
  
  pIVar1 = (this->d).ptr;
  if (pIVar1 != (Interface *)0x0) {
    LOCK();
    (pIVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pIVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pIVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pIVar1 = (this->d).ptr;
      if (pIVar1 != (Interface *)0x0) {
        QDBusIntrospection::Interface::~Interface(pIVar1);
      }
      operator_delete(pIVar1,0x68);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }